

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.hpp
# Opt level: O2

bool openInput(string *filePath,BamReader *br)

{
  bool bVar1;
  ostream *poVar2;
  string indexPath;
  
  bVar1 = BamTools::BamReader::Open(br,filePath);
  if (bVar1) {
    std::operator+(&indexPath,filePath,&indexExt_abi_cxx11_);
    bVar1 = BamTools::BamReader::OpenIndex(br,&indexPath);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR:BamTools Could not open index ");
      poVar2 = std::operator<<(poVar2,(string *)&indexPath);
      std::operator<<(poVar2,'\n');
    }
    std::__cxx11::string::~string((string *)&indexPath);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR:BamTools Could not open ");
    poVar2 = std::operator<<(poVar2,(string *)filePath);
    std::operator<<(poVar2,'\n');
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool openInput(const std::string &filePath, BamTools::BamReader &br)
{
    if (!br.Open(filePath))
    {
        std::cerr << "ERROR:BamTools Could not open " << filePath << '\n';
        return false;
    }
    std::string indexPath = filePath + indexExt;
    if (!br.OpenIndex(indexPath))
    {
        std::cerr << "ERROR:BamTools Could not open index " << indexPath << '\n';
        return false;
    }
    return true;
}